

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.h
# Opt level: O0

void __thiscall disruptor::Sequence::set_sequence(Sequence *this,int64_t value)

{
  undefined8 in_RSI;
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_release,__memory_order_mask);
  *(undefined8 *)(in_RDI + 0x38) = in_RSI;
  return;
}

Assistant:

void set_sequence(int64_t value) {
    sequence_.store(value, std::memory_order::memory_order_release);
  }